

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<void_()>::callback<chat::binder>(callback<void_()> *this,binder *func)

{
  callable_impl<void,_chat::binder> *this_00;
  binder local_40;
  
  this_00 = (callable_impl<void,_chat::binder> *)operator_new(0x28);
  chat::binder::binder(&local_40,func);
  callable_impl<void,_chat::binder>::callable_impl(this_00,&local_40);
  (this->call_ptr).p_ = (callable<void_()> *)this_00;
  booster::atomic_counter::inc();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}